

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

void strscan_double(uint64_t x,TValue *o,int32_t ex2,int32_t neg)

{
  long lVar1;
  ulong uVar2;
  uint64_t rb;
  double dStack_28;
  int32_t b;
  double n;
  int32_t neg_local;
  int32_t ex2_local;
  TValue *o_local;
  uint64_t x_local;
  
  o_local = (TValue *)x;
  if (ex2 < -0x432 && x != 0) {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    if (((int)lVar1 + ex2 < -0x3fe) && (-0x434 < (int)lVar1 + ex2)) {
      uVar2 = 1L << (-(char)ex2 - 0x33U & 0x3f);
      if (((x & uVar2) != 0) && ((x & uVar2 * 3 - 1) != 0)) {
        o_local = (TValue *)(uVar2 * 2 + x);
      }
      o_local = (TValue *)((ulong)o_local & (uVar2 * 2 - 1 ^ 0xffffffffffffffff));
    }
  }
  dStack_28 = (double)(long)o_local;
  if (neg != 0) {
    dStack_28 = -dStack_28;
  }
  if (ex2 != 0) {
    dStack_28 = ldexp(dStack_28,ex2);
  }
  o->n = dStack_28;
  return;
}

Assistant:

static void strscan_double(uint64_t x, TValue *o, int32_t ex2, int32_t neg)
{
  double n;

  /* Avoid double rounding for denormals. */
  if (LJ_UNLIKELY(ex2 <= -1075 && x != 0)) {
    /* NYI: all of this generates way too much code on 32 bit CPUs. */
#if (defined(__GNUC__) || defined(__clang__)) && LJ_64
    int32_t b = (int32_t)(__builtin_clzll(x)^63);
#else
    int32_t b = (x>>32) ? 32+(int32_t)lj_fls((uint32_t)(x>>32)) :
			  (int32_t)lj_fls((uint32_t)x);
#endif
    if ((int32_t)b + ex2 <= -1023 && (int32_t)b + ex2 >= -1075) {
      uint64_t rb = (uint64_t)1 << (-1075-ex2);
      if ((x & rb) && ((x & (rb+rb+rb-1)))) x += rb+rb;
      x = (x & ~(rb+rb-1));
    }
  }

  /* Convert to double using a signed int64_t conversion, then rescale. */
  lj_assertX((int64_t)x >= 0, "bad double conversion");
  n = (double)(int64_t)x;
  if (neg) n = -n;
  if (ex2) n = ldexp(n, ex2);
  o->n = n;
}